

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
* gtl::internal_btree::
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  ::init_internal(btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                  *n,btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                     *parent)

{
  if (((ulong)n & 7) == 0) {
    *(btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
      **)n = parent;
    *(undefined4 *)(n + 8) = 0;
    mutable_child(n,0);
    return n;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
               );
}

Assistant:

static btree_node *init_internal(btree_node *n, btree_node *parent) {
    init_leaf(n, parent, kNodeValues);
    // Set `max_count` to a sentinel value to indicate that this node is
    // internal.
    n->set_max_count(kInternalNodeMaxCount);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        &n->mutable_child(0), (kNodeValues + 1) * sizeof(btree_node *));
    return n;
  }